

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lights.cpp
# Opt level: O3

int __thiscall
DPhased::PhaseHelper(DPhased *this,sector_t *sector,int index,int light,sector_t *prev)

{
  BYTE BVar1;
  int iVar2;
  DPhased *this_00;
  sector_t_conflict *sector_00;
  
  iVar2 = index;
  if ((sector != (sector_t *)0x0) && (sector->validcount != validcount)) {
    BVar1 = (BYTE)light;
    if (sector->lightlevel != 0) {
      BVar1 = (BYTE)sector->lightlevel;
    }
    sector->validcount = validcount;
    this_00 = this;
    if (index != 0) {
      this_00 = (DPhased *)
                M_Malloc_Dbg(0x48,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                             ,0x1f9);
      DLighting::DLighting((DLighting *)this_00,sector);
      (this_00->super_DLighting).super_DSectorEffect.super_DThinker.super_DObject._vptr_DObject =
           (_func_int **)&PTR_StaticType_006f93d8;
    }
    this_00->m_BaseLevel = BVar1;
    sector_00 = sector_t::NextSpecialSector
                          ((sector_t_conflict *)sector,(sector->special == 3) + 3,
                           (sector_t_conflict *)prev);
    iVar2 = PhaseHelper(this,(sector_t *)sector_00,index + 1,(uint)this_00->m_BaseLevel,sector);
    this_00->m_Phase = (BYTE)(((~index + iVar2) * 0x40) / iVar2);
    sector->special = 0;
  }
  return iVar2;
}

Assistant:

int DPhased::PhaseHelper (sector_t *sector, int index, int light, sector_t *prev)
{
	if (!sector || sector->validcount == validcount)
	{
		return index;
	}
	else
	{
		DPhased *l;
		int baselevel = sector->lightlevel ? sector->lightlevel : light;
		sector->validcount = validcount;

		if (index == 0)
		{
			l = this;
			m_BaseLevel = baselevel;
		}
		else
			l = new DPhased (sector, baselevel);

		int numsteps = PhaseHelper (sector->NextSpecialSector (
				sector->special == LightSequenceSpecial1 ?
					LightSequenceSpecial2 : LightSequenceSpecial1, prev),
				index + 1, l->m_BaseLevel, sector);
		l->m_Phase = ((numsteps - index - 1) * 64) / numsteps;

		sector->special = 0;

		return numsteps;
	}
}